

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnElemSegmentElemType
          (BinaryReaderLogging *this,Index index,Type elem_type)

{
  Stream *this_00;
  Enum EVar1;
  Type local_50;
  string local_48;
  
  local_50 = elem_type;
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_48,&local_50);
  Stream::Writef(this_00,"OnElemSegmentElemType(index: %u, type: %s)\n",index,
                 local_48._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x96])(this->reader_,index,local_50);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnElemSegmentElemType(Index index, Type elem_type) {
  LOGF("OnElemSegmentElemType(index: %" PRIindex ", type: %s)\n", index,
       elem_type.GetName().c_str());
  return reader_->OnElemSegmentElemType(index, elem_type);
}